

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

int fctkern__cl_parse_config_logger(fctkern_t *nk)

{
  char *sel_logger_00;
  char *def_logger;
  char *sel_logger;
  fct_logger_i *logger;
  fctkern_t *nk_local;
  
  sel_logger = (char *)0x0;
  sel_logger_00 = fctkern__cl_val2(nk,"--logger","standard");
  if (sel_logger_00 == (char *)0x0) {
    __assert_fail("sel_logger != ((void*)0) && \"should never be NULL\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x82f
                  ,"int fctkern__cl_parse_config_logger(fctkern_t *)");
  }
  if (nk->lt_usr != (fct_logger_types_t *)0x0) {
    sel_logger = (char *)fckern_sel_log(nk->lt_usr,sel_logger_00);
  }
  if ((nk->lt_sys != (fct_logger_types_t *)0x0) && (sel_logger == (char *)0x0)) {
    sel_logger = (char *)fckern_sel_log(nk->lt_sys,sel_logger_00);
  }
  if (sel_logger != (char *)0x0) {
    fctkern__add_logger(nk,(fct_logger_i *)sel_logger);
  }
  else {
    fprintf(_stderr,"error: unknown logger selected - \'%s\'",sel_logger_00);
  }
  nk_local._4_4_ = (uint)(sel_logger != (char *)0x0);
  return nk_local._4_4_;
}

Assistant:

static int
fctkern__cl_parse_config_logger(fctkern_t *nk)
{
    fct_logger_i *logger =NULL;
    char const *sel_logger =NULL;
    char const *def_logger =FCT_DEFAULT_LOGGER;
    sel_logger = fctkern__cl_val2(nk, FCT_OPT_LOGGER, def_logger);
    FCT_ASSERT(sel_logger != NULL && "should never be NULL");
    /* First search the user selected types, then search the
    built-in types. */
    if ( nk->lt_usr != NULL )
    {
        logger = fckern_sel_log(nk->lt_usr, sel_logger);
    }
    if ( nk->lt_sys != NULL && logger == NULL )
    {
        logger = fckern_sel_log(nk->lt_sys, sel_logger);
    }
    if ( logger == NULL )
    {
        /* No logger configured, you must have supplied an invalid selection. */
        fprintf(stderr, "error: unknown logger selected - '%s'", sel_logger);
        return 0;
    }
    fctkern__add_logger(nk, logger);
    logger = NULL;  /* owned by nk. */
    return 1;
}